

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

int * __thiscall
google::protobuf::internal::ExtensionSet::GetRefRepeatedEnum
          (ExtensionSet *this,int number,int index)

{
  anon_enum_32 *v1;
  anon_enum_32 *v2;
  char *pcVar1;
  LogMessage *pLVar2;
  CppType *v1_00;
  CppType *v2_00;
  const_reference piVar3;
  LogMessage local_a0;
  Voidify local_89;
  CppType local_88;
  CppType local_84;
  Nullable<const_char_*> local_80;
  LogMessage local_78;
  Voidify local_61;
  anon_enum_32 local_60;
  anon_enum_32 local_5c;
  Nullable<const_char_*> local_58;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  byte local_39;
  LogMessage local_38;
  Voidify local_21;
  Extension *local_20;
  Extension *extension;
  int index_local;
  int number_local;
  ExtensionSet *this_local;
  
  extension._0_4_ = index;
  extension._4_4_ = number;
  _index_local = this;
  local_20 = FindOrNull(this,number);
  local_39 = 0;
  if (local_20 == (Extension *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x206,"extension != nullptr");
    local_39 = 1;
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [38])"Index out-of-bounds (field is empty).");
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_21,pLVar2);
  }
  if ((local_39 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_38);
  }
  local_5c = (anon_enum_32)((local_20->is_repeated & 1U) == 0);
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::internal::(anonymous_namespace)::__1>(&local_5c);
  local_60 = REPEATED_FIELD;
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::internal::(anonymous_namespace)::__1>(&local_60);
  local_58 = absl::lts_20250127::log_internal::
             Check_EQImpl<google::protobuf::internal::(anonymous_namespace)::__1,google::protobuf::internal::(anonymous_namespace)::__1>
                       (v1,v2,
                        "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == REPEATED_FIELD"
                       );
  if (local_58 != (Nullable<const_char_*>)0x0) {
    pcVar1 = absl::lts_20250127::implicit_cast<char_const*>(local_58);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x207,pcVar1);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_78);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_61,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_78);
  }
  local_84 = anon_unknown_59::cpp_type(local_20->type);
  v1_00 = absl::lts_20250127::log_internal::
          GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_84);
  local_88 = CPPTYPE_ENUM;
  v2_00 = absl::lts_20250127::log_internal::
          GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_88);
  local_80 = absl::lts_20250127::log_internal::
             Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                       (v1_00,v2_00,"cpp_type((*extension).type) == WireFormatLite::CPPTYPE_ENUM");
  if (local_80 != (Nullable<const_char_*>)0x0) {
    pcVar1 = absl::lts_20250127::implicit_cast<char_const*>(local_80);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_a0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x207,pcVar1);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_a0);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_89,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_a0);
  }
  piVar3 = RepeatedField<int>::Get((RepeatedField<int> *)local_20->field_0,(int)extension);
  return piVar3;
}

Assistant:

const int& ExtensionSet::GetRefRepeatedEnum(int number, int index) const {
  const Extension* extension = FindOrNull(number);
  ABSL_CHECK(extension != nullptr) << "Index out-of-bounds (field is empty).";
  ABSL_DCHECK_TYPE(*extension, REPEATED_FIELD, ENUM);
  return extension->ptr.repeated_enum_value->Get(index);
}